

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

bool __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::IsRecordingDeferredCommands
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this)

{
  string msg;
  string local_30;
  
  if ((this->m_Desc).IsDeferred == false) {
    FormatString<char[53]>
              (&local_30,(char (*) [53])"Only deferred contexts may record deferred commands.");
    DebugAssertionFailed
              (local_30._M_dataplus._M_p,"IsRecordingDeferredCommands",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x1f6);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return (this->m_DstImmediateContextId).m_Value != 0xff;
}

Assistant:

bool IsRecordingDeferredCommands() const
    {
        DEV_CHECK_ERR(IsDeferred(), "Only deferred contexts may record deferred commands.");
        return m_DstImmediateContextId != INVALID_CONTEXT_ID;
    }